

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall
TTD::
TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>::
Initialize(TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>
           *this,uint32 capacity)

{
  HeapAllocator *this_00;
  Entry *pEVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  if (this->m_hashArray == (Entry *)0x0) {
    LoadValuesForHashTables(capacity * 2,&this->m_capacity,&this->m_h1Prime,&this->m_h2Prime);
    data.plusSize = (size_t)this->m_capacity;
    local_38 = (undefined1  [8])
               &TTDIdentifierDictionary<unsigned_long,TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo*>
                ::Entry::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_3eb50dd;
    data.filename._0_4_ = 0x4c4;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_38);
    pEVar1 = (Entry *)Memory::HeapAllocator::NoThrowAllocZero(this_00,(ulong)this->m_capacity << 4);
    pEVar1 = TTD_MEM_ALLOC_CHECK<TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo*>::Entry>
                       (pEVar1);
    this->m_hashArray = pEVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Should not already be initialized.");
}

Assistant:

void Initialize(uint32 capacity)
        {
            TTDAssert(this->m_hashArray == nullptr, "Should not already be initialized.");

            uint32 desiredSize = capacity * TTD_DICTIONARY_LOAD_FACTOR;

            LoadValuesForHashTables(desiredSize, &(this->m_capacity), &(this->m_h1Prime), &(this->m_h2Prime));

            this->m_hashArray = TT_HEAP_ALLOC_ARRAY_ZERO(Entry, this->m_capacity);
        }